

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_db_instance_attribute.cc
# Opt level: O2

int __thiscall
aliyun::Rds::DescribeDBInstanceAttribute
          (Rds *this,RdsDescribeDBInstanceAttributeRequestType *req,
          RdsDescribeDBInstanceAttributeResponseType *response,RdsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  Int IVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  char *pcVar7;
  uint index;
  uint index_00;
  allocator<char> local_87c;
  allocator<char> local_87b;
  allocator<char> local_87a;
  allocator<char> local_879;
  Value val;
  value_type local_850;
  Value *local_830;
  string str_response;
  undefined1 local_808 [32];
  _Alloc_hider local_7e8;
  size_type local_7e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d8;
  _Alloc_hider local_7c8;
  size_type local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  _Alloc_hider local_7a8;
  size_type local_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_798;
  _Alloc_hider local_788;
  size_type local_780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  _Alloc_hider local_768;
  size_type local_760;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_758;
  _Alloc_hider local_748;
  size_type local_740;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_738;
  _Alloc_hider local_728;
  size_type local_720;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718;
  _Alloc_hider local_708;
  size_type local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f8;
  _Alloc_hider local_6e8;
  size_type local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  _Alloc_hider local_6c8;
  size_type local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  long local_6a8;
  Int local_6a0;
  _Alloc_hider local_698;
  size_type local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  _Alloc_hider local_678;
  size_type local_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  _Alloc_hider local_658;
  size_type local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  _Alloc_hider local_638;
  size_type local_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  _Alloc_hider local_618;
  size_type local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  _Alloc_hider local_5f8;
  size_type local_5f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8;
  Int local_5d8;
  Int local_5d4;
  _Alloc_hider local_5d0;
  size_type local_5c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c0;
  _Alloc_hider local_5b0;
  size_type local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  _Alloc_hider local_590;
  size_type local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  _Alloc_hider local_570;
  size_type local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  Int local_550;
  Int local_54c;
  _Alloc_hider local_548;
  size_type local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  _Alloc_hider local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  _Alloc_hider local_508;
  size_type local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  _Alloc_hider local_4e8;
  size_type local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  _Alloc_hider local_4c8;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  _Alloc_hider local_4a8;
  size_type local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  _Alloc_hider local_488;
  size_type local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Alloc_hider local_468;
  size_type local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Alloc_hider local_448;
  size_type local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if (this->use_tls_ != false) {
    pcVar7 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar7,(allocator<char> *)local_808);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&local_850);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_808,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_808,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)local_808);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar7,(allocator<char> *)local_808);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_808);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DescribeDBInstanceAttribute",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"OwnerId",(allocator<char> *)local_808);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"ResourceOwnerAccount",(allocator<char> *)local_808);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"ResourceOwnerId",(allocator<char> *)local_808);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->client_token)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"ClientToken",(allocator<char> *)local_808);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->client_token);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((req->db_instance_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"DBInstanceId",(allocator<char> *)local_808);
    std::__cxx11::string::string((string *)&local_3a0,(string *)&req->db_instance_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"OwnerAccount",(allocator<char> *)local_808);
    std::__cxx11::string::string((string *)&local_3e0,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"RegionId",(allocator<char> *)local_808);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_400);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (RdsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_808,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_808,anon_var_dwarf_2e8ef7 + 9,&local_879);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_808);
        std::__cxx11::string::~string((string *)local_808);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_808,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_808,anon_var_dwarf_2e8ef7 + 9,&local_87a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_808);
        std::__cxx11::string::~string((string *)local_808);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_808,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_808,anon_var_dwarf_2e8ef7 + 9,&local_87b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_808);
        std::__cxx11::string::~string((string *)local_808);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_808,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_808,anon_var_dwarf_2e8ef7 + 9,&local_87c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_808);
        std::__cxx11::string::~string((string *)local_808);
      }
      if (response != (RdsDescribeDBInstanceAttributeResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Items");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Items");
          bVar1 = Json::Value::isMember(pVVar5,"DBInstanceAttribute");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"Items");
            pVVar5 = Json::Value::operator[](pVVar5,"DBInstanceAttribute");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              local_830 = pVVar5;
              for (index_00 = 0; pVVar5 = local_830, AVar3 = Json::Value::size(local_830),
                  index_00 < AVar3; index_00 = index_00 + 1) {
                local_808._0_8_ = (pointer)0x0;
                local_808._8_8_ = (pointer)0x0;
                local_808._16_8_ = 0;
                local_7e8._M_p = (pointer)&local_7d8;
                local_7e0 = 0;
                local_7d8._M_local_buf[0] = '\0';
                local_7c8._M_p = (pointer)&local_7b8;
                local_7c0 = 0;
                local_7b8._M_local_buf[0] = '\0';
                local_7a8._M_p = (pointer)&local_798;
                local_7a0 = 0;
                local_798._M_local_buf[0] = '\0';
                local_788._M_p = (pointer)&local_778;
                local_780 = 0;
                local_778._M_local_buf[0] = '\0';
                local_768._M_p = (pointer)&local_758;
                local_760 = 0;
                local_758._M_local_buf[0] = '\0';
                local_748._M_p = (pointer)&local_738;
                local_740 = 0;
                local_738._M_local_buf[0] = '\0';
                local_728._M_p = (pointer)&local_718;
                local_720 = 0;
                local_718._M_local_buf[0] = '\0';
                local_708._M_p = (pointer)&local_6f8;
                local_700 = 0;
                local_6f8._M_local_buf[0] = '\0';
                local_6e8._M_p = (pointer)&local_6d8;
                local_6e0 = 0;
                local_6d8._M_local_buf[0] = '\0';
                local_6c8._M_p = (pointer)&local_6b8;
                local_6c0 = 0;
                local_6b8._M_local_buf[0] = '\0';
                local_698._M_p = (pointer)&local_688;
                local_690 = 0;
                local_688._M_local_buf[0] = '\0';
                local_678._M_p = (pointer)&local_668;
                local_670 = 0;
                local_668._M_local_buf[0] = '\0';
                local_658._M_p = (pointer)&local_648;
                local_650 = 0;
                local_648._M_local_buf[0] = '\0';
                local_638._M_p = (pointer)&local_628;
                local_630 = 0;
                local_628._M_local_buf[0] = '\0';
                local_618._M_p = (pointer)&local_608;
                local_610 = 0;
                local_608._M_local_buf[0] = '\0';
                local_5f8._M_p = (pointer)&local_5e8;
                local_5f0 = 0;
                local_5e8._M_local_buf[0] = '\0';
                local_5d0._M_p = (pointer)&local_5c0;
                local_5c8 = 0;
                local_5c0._M_local_buf[0] = '\0';
                local_5b0._M_p = (pointer)&local_5a0;
                local_5a8 = 0;
                local_5a0._M_local_buf[0] = '\0';
                local_590._M_p = (pointer)&local_580;
                local_588 = 0;
                local_580._M_local_buf[0] = '\0';
                local_570._M_p = (pointer)&local_560;
                local_568 = 0;
                local_560._M_local_buf[0] = '\0';
                local_548._M_p = (pointer)&local_538;
                local_540 = 0;
                local_538._M_local_buf[0] = '\0';
                local_528._M_p = (pointer)&local_518;
                local_520 = 0;
                local_518._M_local_buf[0] = '\0';
                local_508._M_p = (pointer)&local_4f8;
                local_500 = 0;
                local_4f8._M_local_buf[0] = '\0';
                local_4e8._M_p = (pointer)&local_4d8;
                local_4e0 = 0;
                local_4d8._M_local_buf[0] = '\0';
                local_4c8._M_p = (pointer)&local_4b8;
                local_4c0 = 0;
                local_4b8._M_local_buf[0] = '\0';
                local_4a8._M_p = (pointer)&local_498;
                local_4a0 = 0;
                local_498._M_local_buf[0] = '\0';
                local_488._M_p = (pointer)&local_478;
                local_480 = 0;
                local_478._M_local_buf[0] = '\0';
                local_468._M_p = (pointer)&local_458;
                local_460 = 0;
                local_458._M_local_buf[0] = '\0';
                local_448._M_p = (pointer)&local_438;
                local_440 = 0;
                local_438._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar5,index_00);
                bVar1 = Json::Value::isMember(pVVar5,"InsId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"InsId");
                  local_808._24_4_ = Json::Value::asInt(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBInstanceId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBInstanceId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_7e8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"PayType");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"PayType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_7c8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBInstanceClassType");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBInstanceClassType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_7a8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBInstanceType");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBInstanceType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_788,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"RegionId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"RegionId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_768,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"ConnectionString");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"ConnectionString");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_748,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Port");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Port");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_728,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Engine");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Engine");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_708,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"EngineVersion");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"EngineVersion");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_6e8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBInstanceClass");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBInstanceClass");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_6c8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBInstanceMemory");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBInstanceMemory");
                  IVar4 = Json::Value::asInt(pVVar6);
                  local_6a8 = (long)IVar4;
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBInstanceStorage");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBInstanceStorage");
                  local_6a0 = Json::Value::asInt(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBInstanceNetType");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBInstanceNetType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_698,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBInstanceStatus");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBInstanceStatus");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_678,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBInstanceDescription");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBInstanceDescription");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_658,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"LockMode");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"LockMode");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_638,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"LockReason");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"LockReason");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_618,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"ReadDelayTime");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"ReadDelayTime");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_5f8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DBMaxQuantity");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DBMaxQuantity");
                  local_5d8 = Json::Value::asInt(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"AccountMaxQuantity");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"AccountMaxQuantity");
                  local_5d4 = Json::Value::asInt(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"CreationTime");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"CreationTime");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_5d0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"ExpireTime");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"ExpireTime");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_5b0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"MaintainTime");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"MaintainTime");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_590,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"AvailabilityValue");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"AvailabilityValue");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_570,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"MaxIOPS");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"MaxIOPS");
                  local_550 = Json::Value::asInt(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"MaxConnections");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"MaxConnections");
                  local_54c = Json::Value::asInt(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"MasterInstanceId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"MasterInstanceId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_548,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"IncrementSourceDBInstanceId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"IncrementSourceDBInstanceId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_528,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"GuardDBInstanceId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"GuardDBInstanceId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_508,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"TempDBInstanceId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"TempDBInstanceId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_4e8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"SecurityIPList");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"SecurityIPList");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_4c8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"ZoneId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"ZoneId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_4a8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"InstanceNetworkType");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"InstanceNetworkType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_488,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"VpcId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"VpcId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_468,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"ConnectionMode");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"ConnectionMode");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_448,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"ReadOnlyDBInstanceIds");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"ReadOnlyDBInstanceIds");
                  bVar1 = Json::Value::isMember(pVVar6,"ReadOnlyDBInstanceId");
                  if (bVar1) {
                    pVVar5 = Json::Value::operator[](pVVar5,"ReadOnlyDBInstanceIds");
                    pVVar5 = Json::Value::operator[](pVVar5,"ReadOnlyDBInstanceId");
                    bVar1 = Json::Value::isArray(pVVar5);
                    if (bVar1) {
                      for (index = 0; AVar3 = Json::Value::size(pVVar5), index < AVar3;
                          index = index + 1) {
                        local_850.db_instance_id._M_dataplus._M_p =
                             (pointer)&local_850.db_instance_id.field_2;
                        local_850.db_instance_id._M_string_length = 0;
                        local_850.db_instance_id.field_2._M_local_buf[0] = '\0';
                        pVVar6 = Json::Value::operator[](pVVar5,index);
                        bVar1 = Json::Value::isMember(pVVar6,"DBInstanceId");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar6,"DBInstanceId");
                          Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                          std::__cxx11::string::operator=((string *)&local_850,(string *)&local_160)
                          ;
                          std::__cxx11::string::~string((string *)&local_160);
                        }
                        std::
                        vector<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>_>
                        ::push_back((vector<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>_>
                                     *)local_808,&local_850);
                        std::__cxx11::string::~string((string *)&local_850);
                      }
                    }
                  }
                }
                std::
                vector<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>_>
                ::push_back(&response->items,(value_type *)local_808);
                RdsDescribeDBInstanceAttributeDBInstanceAttributeType::
                ~RdsDescribeDBInstanceAttributeDBInstanceAttributeType
                          ((RdsDescribeDBInstanceAttributeDBInstanceAttributeType *)local_808);
              }
              iVar2 = 200;
            }
          }
        }
      }
      goto LAB_00164b45;
    }
  }
  iVar2 = -1;
  if (error_info != (RdsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00164b45:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Rds::DescribeDBInstanceAttribute(const RdsDescribeDBInstanceAttributeRequestType& req,
                      RdsDescribeDBInstanceAttributeResponseType* response,
                       RdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDBInstanceAttribute");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.client_token.empty()) {
    req_rpc->AddRequestQuery("ClientToken", req.client_token);
  }
  if(!req.db_instance_id.empty()) {
    req_rpc->AddRequestQuery("DBInstanceId", req.db_instance_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}